

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf,size_t body_size)

{
  int iVar1;
  byte *pbVar2;
  size_t sVar3;
  size_t __n;
  uint8_t sizebuf [8];
  byte local_38;
  undefined1 local_37 [7];
  undefined1 *local_30;
  
  pbVar2 = &local_38;
  if (0x3f < body_size) {
    if (body_size < 0x4000) {
      local_38 = (byte)(body_size >> 8) | 0x40;
      pbVar2 = local_37;
    }
    else {
      ptls_buffer__adjust_quic_blocksize_cold_1();
      pbVar2 = local_30;
    }
  }
  *pbVar2 = (char)body_size;
  sVar3 = (long)pbVar2 - (long)&local_38;
  __n = sVar3 + 1;
  if (__n == 1) {
    sVar3 = buf->off;
  }
  else {
    iVar1 = ptls_buffer_reserve_aligned(buf,sVar3,'\0');
    if (iVar1 != 0) {
      return iVar1;
    }
    memmove(buf->base + (buf->off - body_size) + sVar3,buf->base + (buf->off - body_size),body_size)
    ;
    sVar3 = sVar3 + buf->off;
    buf->off = sVar3;
  }
  memcpy(buf->base + ((sVar3 - body_size) - __n),&local_38,__n);
  return 0;
}

Assistant:

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf, size_t body_size)
{
    uint8_t sizebuf[PTLS_ENCODE_QUICINT_CAPACITY];
    size_t sizelen = ptls_encode_quicint(sizebuf, body_size) - sizebuf;

    /* adjust amount of space before body_size to `sizelen` bytes */
    if (sizelen != 1) {
        int ret;
        if ((ret = ptls_buffer_reserve(buf, sizelen - 1)) != 0)
            return ret;
        memmove(buf->base + buf->off - body_size - 1 + sizelen, buf->base + buf->off - body_size, body_size);
        buf->off += sizelen - 1;
    }

    /* write the size */
    memcpy(buf->base + buf->off - body_size - sizelen, sizebuf, sizelen);

    return 0;
}